

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement_strings.cpp
# Opt level: O0

void __thiscall MeasurementStrings_basic_Test::TestBody(MeasurementStrings_basic_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  char *pcVar3;
  AssertHelper local_320;
  Message local_318;
  double local_310;
  double local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_2d0;
  Message local_2c8 [6];
  exception *e;
  string local_290;
  undefined1 local_270 [24];
  undefined1 auStack_258 [8];
  TrueWithString gtest_msg;
  AssertHelper local_230;
  Message local_228;
  precise_measurement local_220;
  precise_measurement local_208;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_3;
  string local_1d8;
  undefined1 local_1b8 [24];
  AssertHelper local_1a0;
  Message local_198;
  precise_measurement local_190;
  precise_measurement local_178;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  string local_148;
  undefined1 local_128 [24];
  AssertHelper local_110;
  Message local_108;
  precise_measurement local_100;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar_1;
  string local_d0;
  undefined1 local_b0 [24];
  AssertHelper local_98;
  Message local_90;
  precise_measurement local_88;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  allocator local_49;
  string local_48;
  undefined1 auStack_28 [8];
  precise_measurement pm;
  MeasurementStrings_basic_Test *this_local;
  
  pm.units_._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"45 m",&local_49);
  uVar2 = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)auStack_28,&local_48,uVar2);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  units::operator*(&local_88,45.0,(precise_unit *)units::precise::m);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_70,"pm","45.0 * precise::m",(precise_measurement *)auStack_28,
             &local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
  if (!bVar1) {
    testing::Message::Message(&local_90);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_70);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x13,pcVar3);
    testing::internal::AssertHelper::operator=(&local_98,&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"9.0 * 5.0 m",
             (allocator *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)local_b0,&local_d0,uVar2);
  pm.units_.multiplier_ = (double)local_b0._16_8_;
  auStack_28 = (undefined1  [8])local_b0._0_8_;
  pm.value_ = (double)local_b0._8_8_;
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_1.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  units::operator*(&local_100,45.0,(precise_unit *)units::precise::m);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_e8,"pm","45.0 * precise::m",(precise_measurement *)auStack_28,
             &local_100);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"23.7 m/s",
             (allocator *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)local_128,&local_148,uVar2);
  pm.units_.multiplier_ = (double)local_128._16_8_;
  auStack_28 = (undefined1  [8])local_128._0_8_;
  pm.value_ = (double)local_128._8_8_;
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_2.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  units::operator*(&local_190,23.7,(precise_unit *)units::precise::m);
  units::precise_measurement::operator/(&local_178,&local_190,(precise_unit *)units::precise::s);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_160,"pm","23.7 * precise::m / precise::s",
             (precise_measurement *)auStack_28,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(&local_198);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x19,pcVar3);
    testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_1a0);
    testing::Message::~Message(&local_198);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_1d8,"99.9 N * m",
             (allocator *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  uVar2 = units::getDefaultFlags();
  units::measurement_from_string((precise_measurement *)local_1b8,&local_1d8,uVar2);
  pm.units_.multiplier_ = (double)local_1b8._16_8_;
  auStack_28 = (undefined1  [8])local_1b8._0_8_;
  pm.value_ = (double)local_1b8._8_8_;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  units::operator*(&local_220,99.9,(precise_unit *)units::precise::N);
  units::precise_measurement::operator*(&local_208,&local_220,(precise_unit *)units::precise::m);
  testing::internal::EqHelper::
  Compare<units::precise_measurement,_units::precise_measurement,_nullptr>
            ((EqHelper *)local_1f0,"pm","99.9 * precise::N * precise::m",
             (precise_measurement *)auStack_28,&local_208);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_228);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_258 = (undefined1  [8])0x0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_258);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_258);
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_290,"",(allocator *)((long)&e + 7));
      uVar2 = units::getDefaultFlags();
      units::measurement_from_string((precise_measurement *)local_270,&local_290,uVar2);
      auStack_28 = (undefined1  [8])local_270._0_8_;
      pm.value_ = (double)local_270._8_8_;
      pm.units_.multiplier_ = (double)local_270._16_8_;
      std::__cxx11::string::~string((string *)&local_290);
      std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
    }
  }
  else {
    testing::Message::Message(local_2c8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &gtest_ar_4.message_,
                   "Expected: pm = measurement_from_string(\"\") doesn\'t throw an exception.\n  Actual: "
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_258
                  );
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x1d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2d0,local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(local_2c8);
  }
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_258);
  local_308 = units::precise_measurement::value((precise_measurement *)auStack_28);
  local_310 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_300,"pm.value()","0.0",&local_308,&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_measurement_strings.cpp"
               ,0x1e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  return;
}

Assistant:

TEST(MeasurementStrings, basic)
{
    auto pm = measurement_from_string("45 m");
    EXPECT_EQ(pm, 45.0 * precise::m);

    pm = measurement_from_string("9.0 * 5.0 m");
    EXPECT_EQ(pm, 45.0 * precise::m);

    pm = measurement_from_string("23.7 m/s");
    EXPECT_EQ(pm, 23.7 * precise::m / precise::s);
    pm = measurement_from_string("99.9 N * m");
    EXPECT_EQ(pm, 99.9 * precise::N * precise::m);

    EXPECT_NO_THROW(pm = measurement_from_string(""));
    EXPECT_EQ(pm.value(), 0.0);
}